

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)19>_> *
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::createDescriptorSetLayout
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,DeviceInterface *vki,
          VkDevice device,VkDescriptorType descriptorType,ShaderInputInterface shaderInterface,
          VkShaderStageFlags stageFlags,DescriptorUpdateMethod updateMethod)

{
  VkDescriptorSetLayoutCreateFlags local_7c;
  undefined1 local_78 [4];
  VkDescriptorSetLayoutCreateFlags extraFlags;
  DescriptorSetLayoutBuilder builder;
  VkShaderStageFlags stageFlags_local;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  
  builder.m_immutableSamplers.
  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = stageFlags;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_78);
  local_7c = 0;
  if ((updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) ||
     (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) {
    local_7c = 1;
  }
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)local_78,descriptorType,
               builder.m_immutableSamplers.
               super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)local_78,descriptorType,
               builder.m_immutableSamplers.
               super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)local_78,descriptorType,
               builder.m_immutableSamplers.
               super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  else if (shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    ::vk::DescriptorSetLayoutBuilder::addArrayBinding
              ((DescriptorSetLayoutBuilder *)local_78,descriptorType,2,
               builder.m_immutableSamplers.
               super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  ::vk::DescriptorSetLayoutBuilder::build
            (__return_storage_ptr__,(DescriptorSetLayoutBuilder *)local_78,vki,device,local_7c);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_78);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkDescriptorSetLayout> BufferRenderInstance::createDescriptorSetLayout (const vk::DeviceInterface&	vki,
																					 vk::VkDevice				device,
																					 vk::VkDescriptorType		descriptorType,
																					 ShaderInputInterface		shaderInterface,
																					 vk::VkShaderStageFlags		stageFlags,
																					 DescriptorUpdateMethod		updateMethod)
{
	vk::DescriptorSetLayoutBuilder			builder;
	vk::VkDescriptorSetLayoutCreateFlags	extraFlags			= 0;

	if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE ||
			updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		extraFlags |= vk::VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR;
	}

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			builder.addSingleBinding(descriptorType, stageFlags);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			builder.addSingleBinding(descriptorType, stageFlags);
			builder.addSingleBinding(descriptorType, stageFlags);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			builder.addArrayBinding(descriptorType, 2u, stageFlags);
			break;

		default:
			DE_FATAL("Impossible");
	}

	return builder.build(vki, device, extraFlags);
}